

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* serviceFlagsToStr_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,uint64_t flags)

{
  long lVar1;
  undefined8 uVar2;
  char *pcVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  ulong local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = 0;
  do {
    lVar1 = 1L << ((byte)uVar4 & 0x3f);
    if ((flags >> (uVar4 & 0x3f) & 1) != 0) {
      local_60 = uVar4;
      if (lVar1 < 0x40) {
        if (lVar1 == 1) {
          local_58.field_2._M_local_buf[4] = 'O';
          local_58.field_2._M_local_buf[5] = 'R';
          local_58.field_2._M_local_buf[6] = 'K';
          local_58.field_2._M_allocated_capacity._0_4_ = 0x5754454e;
LAB_006cb3c7:
          local_58._M_string_length = 7;
          pcVar3 = local_58.field_2._M_local_buf + 7;
          goto LAB_006cb44f;
        }
        if (lVar1 == 4) {
          local_58.field_2._M_local_buf[4] = 'M';
          local_58.field_2._M_allocated_capacity._0_4_ = 0x4f4f4c42;
          local_58._M_string_length = 5;
          pcVar3 = local_58.field_2._M_local_buf + 5;
          goto LAB_006cb44f;
        }
        if (lVar1 == 8) {
          local_58.field_2._M_local_buf[4] = 'E';
          local_58.field_2._M_local_buf[5] = 'S';
          local_58.field_2._M_local_buf[6] = 'S';
          local_58.field_2._M_allocated_capacity._0_4_ = 0x4e544957;
          goto LAB_006cb3c7;
        }
LAB_006cb3f0:
        tinyformat::format<unsigned_long>(&local_58,"UNKNOWN[2^%u]",&local_60);
      }
      else {
        if (lVar1 == 0x40) {
          local_58.field_2._8_7_ = 0x535245544c4946;
          uVar2 = 0x5f544341504d4f43;
        }
        else {
          if (lVar1 != 0x400) {
            if (lVar1 != 0x800) goto LAB_006cb3f0;
            local_58.field_2._M_local_buf[4] = 'V';
            local_58.field_2._M_local_buf[5] = '2';
            local_58.field_2._M_allocated_capacity._0_4_ = 0x5f503250;
            local_58._M_string_length = 6;
            pcVar3 = local_58.field_2._M_local_buf + 6;
            goto LAB_006cb44f;
          }
          local_58.field_2._8_7_ = 0x444554494d494c;
          uVar2 = 0x5f4b524f5754454e;
        }
        local_58.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar2;
        local_58.field_2._M_local_buf[4] = (char)((ulong)uVar2 >> 0x20);
        local_58.field_2._M_local_buf[5] = (char)((ulong)uVar2 >> 0x28);
        local_58.field_2._M_local_buf[6] = (char)((ulong)uVar2 >> 0x30);
        local_58.field_2._M_local_buf[7] = (char)((ulong)uVar2 >> 0x38);
        local_58._M_string_length = 0xf;
        pcVar3 = local_58.field_2._M_local_buf + 0xf;
LAB_006cb44f:
        *pcVar3 = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT17(local_58.field_2._M_local_buf[7],
                                 CONCAT16(local_58.field_2._M_local_buf[6],
                                          CONCAT15(local_58.field_2._M_local_buf[5],
                                                   CONCAT14(local_58.field_2._M_local_buf[4],
                                                            local_58.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
    }
    uVar4 = uVar4 + 1;
    if (uVar4 == 0x40) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

std::vector<std::string> serviceFlagsToStr(uint64_t flags)
{
    std::vector<std::string> str_flags;

    for (size_t i = 0; i < sizeof(flags) * 8; ++i) {
        if (flags & (1ULL << i)) {
            str_flags.emplace_back(serviceFlagToStr(i));
        }
    }

    return str_flags;
}